

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

void __thiscall capnp::Schema::requireUsableAs(Schema *this,RawSchema *expected)

{
  bool bVar1;
  bool local_71;
  bool local_65;
  Fault local_58;
  Fault f;
  DebugComparison<const_capnp::_::RawSchema_*const_&,_const_capnp::_::RawSchema_*&> local_48;
  bool local_19;
  RawSchema *pRStack_18;
  bool _kjCondition;
  RawSchema *expected_local;
  Schema *this_local;
  
  pRStack_18 = expected;
  expected_local = (RawSchema *)this;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->raw->generic);
  kj::_::DebugExpression<capnp::_::RawSchema_const*const&>::operator==
            (&local_48,(DebugExpression<capnp::_::RawSchema_const*const&> *)&f,
             &stack0xffffffffffffffe8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_48);
  local_65 = true;
  if (!bVar1) {
    local_71 = false;
    if (pRStack_18 != (RawSchema *)0x0) {
      local_71 = this->raw->generic->canCastTo == pRStack_18;
    }
    local_65 = local_71;
  }
  local_19 = local_65;
  if (local_65 != false) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[62]>
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x146,FAILED,
             "raw->generic == expected || (expected != nullptr && raw->generic->canCastTo == expected)"
             ,"_kjCondition,\"This schema is not compatible with the requested native type.\"",
             &local_19,
             (char (*) [62])"This schema is not compatible with the requested native type.");
  kj::_::Debug::Fault::fatal(&local_58);
}

Assistant:

void Schema::requireUsableAs(const _::RawSchema* expected) const {
  KJ_REQUIRE(raw->generic == expected ||
             (expected != nullptr && raw->generic->canCastTo == expected),
             "This schema is not compatible with the requested native type.");
}